

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03_signal_epoll.c
# Opt level: O3

void copy_fd(int in,int out)

{
  int iVar1;
  ssize_t sVar2;
  size_t __n;
  int *piVar3;
  long lVar4;
  epoll_data_t *peVar5;
  char **argv;
  int iVar6;
  char *pcVar7;
  char buff [1024];
  _union_1457 _Stack_4c0;
  sigset_t sStack_4b8;
  undefined4 uStack_438;
  ulong uStack_428;
  code *pcStack_420;
  char acStack_418 [1024];
  
  pcVar7 = acStack_418;
  pcStack_420 = (code *)0x10140d;
  memset(acStack_418,0,0x400);
  pcStack_420 = (code *)0x10141c;
  sVar2 = read(in,acStack_418,0x3ff);
  if ((int)sVar2 != 0) {
    if ((int)sVar2 == -1) {
      pcStack_420 = setup_signals;
      copy_fd_cold_1();
      uStack_428 = (ulong)(uint)out;
      pcStack_420 = (code *)acStack_418;
      if (1 < in) {
        pcStack_420 = (code *)acStack_418;
        piVar3 = __errno_location();
        *piVar3 = 0;
        lVar4 = strtol(*(char **)(pcVar7 + 8),(char **)0x0,10);
        if (*piVar3 == 0) {
          if (lVar4 == 0) goto LAB_001014ea;
          printf("Alarm after %ld seconds.\n",lVar4);
          sigemptyset(&sStack_4b8);
          uStack_438 = 0x10000000;
          _Stack_4c0.sa_handler = sigalrm_handler;
          iVar1 = sigaction(0xe,(sigaction *)&_Stack_4c0,(sigaction *)0x0);
          if (iVar1 != -1) {
            alarm((uint)lVar4);
            return;
          }
        }
        else {
          setup_signals_cold_1();
        }
        setup_signals_cold_2();
        iVar1 = 0;
        epollfd = epoll_create1(0);
        if (epollfd != -1) {
          return;
        }
        setup_epoll_cold_1();
        ev.events = 1;
        argv = (char **)0x1;
        iVar6 = epollfd;
        ev.data.fd = iVar1;
        iVar1 = epoll_ctl(epollfd,1,iVar1,(epoll_event *)&ev);
        if (iVar1 != -1) {
          return;
        }
        add_fd_to_epoll_cold_1();
        setup_signals(iVar6,argv);
        setup_epoll();
        add_fd_to_epoll(0);
        listen_sock = setup_listening_socket(5000);
        add_fd_to_epoll(listen_sock);
        nfds = epoll_wait(epollfd,(epoll_event *)events,10,-1);
        do {
          if (nfds == -1) {
            pcVar7 = "epoll_wait()";
LAB_0010169e:
            perror(pcVar7);
            exit(1);
          }
          if (0 < nfds) {
            peVar5 = &events[0].data;
            lVar4 = 0;
            do {
              iVar1 = peVar5->fd;
              if (iVar1 == 0) {
                puts("stdin ready..");
                iVar1 = 0;
                iVar6 = 1;
LAB_0010161e:
                copy_fd(iVar1,iVar6);
              }
              else {
                if (iVar1 == conn_sock) {
                  puts("socket data ready..");
                  iVar1 = conn_sock;
                  iVar6 = conn_sock;
                  goto LAB_0010161e;
                }
                if (iVar1 == listen_sock) {
                  puts("new connection ready..");
                  conn_sock = accept(listen_sock,(sockaddr *)0x0,(socklen_t *)0x0);
                  if (conn_sock == -1) {
                    pcVar7 = "accept()";
                    goto LAB_0010169e;
                  }
                  add_fd_to_epoll(conn_sock);
                }
              }
              lVar4 = lVar4 + 1;
              peVar5 = (epoll_data_t *)(&peVar5->fd + 3);
            } while (lVar4 < nfds);
          }
          nfds = epoll_wait(epollfd,(epoll_event *)events,10,-1);
        } while( true );
      }
LAB_001014ea:
      puts("No alarm set. Will not be interrupted.");
      return;
    }
    pcStack_420 = (code *)0x101430;
    __n = strlen(acStack_418);
    pcStack_420 = (code *)0x10143d;
    write(out,acStack_418,__n);
  }
  return;
}

Assistant:

void copy_fd(int in, int out) {
    char buff[1024];
    int bytes_read;

    bzero(buff, sizeof(buff));
    bytes_read = read(in, buff, sizeof(buff)-1 );
    if (bytes_read == -1)
        handle_error("read");
    else if (bytes_read == 0)
        return;
    write(out, buff, strlen(buff));
}